

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall asl::String::split(String *this,Array<asl::String> *a)

{
  int iVar1;
  char *this_00;
  bool bVar2;
  int iVar3;
  String local_40;
  int local_28;
  int local_24;
  int j;
  int i;
  char *s;
  Array<asl::String> *a_local;
  String *this_local;
  
  s = (char *)a;
  a_local = (Array<asl::String> *)this;
  Array<asl::String>::clear(a);
  _j = str(this);
  local_24 = 0;
  do {
    iVar1 = local_24;
    iVar3 = length(this);
    if (iVar3 < iVar1) {
      return;
    }
    bVar2 = myisspace(_j[local_24]);
    iVar1 = local_24;
    if (!bVar2) {
      do {
        local_28 = iVar1 + 1;
        iVar1 = local_28;
        iVar3 = length(this);
        if (iVar3 + 1 <= iVar1) goto LAB_00133643;
        bVar2 = myisspace(_j[local_28]);
        this_00 = s;
      } while ((!bVar2) && (iVar1 = local_28, _j[local_28] != '\0'));
      substring(&local_40,this,local_24,local_28);
      Array<asl::String>::operator<<((Array<asl::String> *)this_00,&local_40);
      ~String(&local_40);
      local_24 = local_28;
    }
LAB_00133643:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void String::split(Array<String>& a) const
{
	a.clear();
	const char* s = str();
	for(int i=0; i<=length(); i++)
	{
		if(myisspace(s[i]))
			continue;
		for(int j=i+1; j<length()+1; j++)
		{
			if(myisspace(s[j]) || s[j]=='\0')
			{
				a << substring(i, j);
				i=j;
				break;
			}
		}
	}
}